

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationZ.hpp
# Opt level: O0

RotationZ<std::complex<double>_> *
qclab::qgates::operator*
          (RotationZ<std::complex<double>_> *__return_storage_ptr__,
          RotationZ<std::complex<double>_> *lhs,RotationZ<std::complex<double>_> *rhs)

{
  int iVar1;
  int iVar2;
  RotationZ<std::complex<double>_> *rhs_local;
  RotationZ<std::complex<double>_> *lhs_local;
  
  iVar1 = QGate1<std::complex<double>_>::qubit((QGate1<std::complex<double>_> *)lhs);
  iVar2 = (*(rhs->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
            super_QObject<std::complex<double>_>._vptr_QObject[3])();
  if (iVar1 == iVar2) {
    RotationZ<std::complex<double>_>::operator*=(lhs,rhs);
    RotationZ<std::complex<double>_>::RotationZ(__return_storage_ptr__,lhs);
    return __return_storage_ptr__;
  }
  __assert_fail("lhs.qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/include/qclab/qgates/RotationZ.hpp"
                ,0xb2,"RotationZ<T> qclab::qgates::operator*(RotationZ<T>, const RotationZ<T> &)");
}

Assistant:

RotationZ< T > operator*( RotationZ< T > lhs ,
                                         const RotationZ< T >& rhs ) {
          assert( lhs.qubit() == rhs.qubit() ) ;
          lhs *= rhs ;
          return lhs ;
        }